

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O2

int CountOccurrences(CommandLineArguments *args,char *arg)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar3 = 0;
  uVar4 = (ulong)(uint)args->argc_;
  if (args->argc_ < 1) {
    uVar4 = uVar3;
  }
  iVar2 = 0;
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar1 = strcmp(args->argv_[uVar3],arg);
    iVar2 = iVar2 + (uint)(iVar1 == 0);
  }
  return iVar2;
}

Assistant:

static int CountOccurrences(const CommandLineArguments* const args,
                            const char* const arg) {
  int i;
  int num_occurences = 0;

  for (i = 0; i < args->argc_; ++i) {
    if (!strcmp(args->argv_[i], arg)) {
      ++num_occurences;
    }
  }
  return num_occurences;
}